

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

sexp_conflict sexp_fork_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  __pid_t _Var1;
  sexp_conflict psVar2;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    (((ctx->value).type.setters)->value).context.mark_stack[9].prev = (sexp_mark_stack_ptr_t *)0x23e
    ;
    (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)0x23e;
    (((ctx->value).type.setters)->value).context.mark_stack[10].end = (sexp_conflict *)0x23e;
  }
  psVar2 = (sexp_conflict)sexp_make_integer(ctx,(long)_Var1,(long)(_Var1 >> 0x1f));
  return psVar2;
}

Assistant:

sexp sexp_fork_stub (sexp ctx, sexp self, sexp_sint_t n) {
  sexp res;
  res = sexp_make_integer(ctx, sexp_fork_and_kill_threads(ctx));
  return res;
}